

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatdc.c
# Opt level: O1

uint8 ecx_parentport(ecx_contextt *context,uint16 parent)

{
  byte bVar1;
  uint8 uVar2;
  uint8 *puVar3;
  byte bVar4;
  undefined6 in_register_00000032;
  
  puVar3 = &context->slavelist[CONCAT62(in_register_00000032,parent) & 0xffffffff].consumedports;
  bVar1 = *puVar3;
  if ((bVar1 & 8) == 0) {
    if ((bVar1 & 2) == 0) {
      if ((bVar1 & 4) == 0) {
        bVar4 = bVar1 & 0xf0;
        if ((bVar1 & 1) == 0) {
          bVar4 = bVar1;
        }
        uVar2 = '\0';
      }
      else {
        bVar4 = bVar1 & 0xf1;
        uVar2 = '\x02';
      }
    }
    else {
      bVar4 = bVar1 & 0xf5;
      uVar2 = '\x01';
    }
  }
  else {
    bVar4 = bVar1 & 0xf7;
    uVar2 = '\x03';
  }
  *puVar3 = bVar4;
  return uVar2;
}

Assistant:

static uint8 ecx_parentport(ecx_contextt *context, uint16 parent)
{
   uint8 parentport = 0;
   uint8 b;
   /* search order is important, here 3 - 1 - 2 - 0 */
   b = context->slavelist[parent].consumedports;
   if (b & PORTM3)
   {
      parentport = 3;
      b &= (uint8)~PORTM3;
   }
   else if (b & PORTM1)
   {
      parentport = 1;
      b &= (uint8)~PORTM1;
   }
   else if (b & PORTM2)
   {
      parentport = 2;
      b &= (uint8)~PORTM2;
   }
   else if (b & PORTM0)
   {
      parentport = 0;
      b &= (uint8)~PORTM0;
   }
   context->slavelist[parent].consumedports = b;
   return parentport;
}